

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi.cpp
# Opt level: O1

void mpp_show_support_format(void)

{
  long lVar1;
  
  _mpp_log_l(4,"mpi","mpp coding type support list:",(char *)0x0);
  lVar1 = 0x10;
  do {
    _mpp_log_l(4,"mpi","type: %s id %d coding: %-16s id %d\n",(char *)0x0,
               *(undefined8 *)((long)Mpp::set_io_mode::iomode_2str + lVar1 + 8),
               (ulong)*(uint *)((long)Mpp::set_io_mode::iomode_2str + lVar1),
               *(undefined8 *)((long)&support_list[0].type + lVar1),
               (ulong)*(uint *)((long)Mpp::set_io_mode::iomode_2str + lVar1 + 4));
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 400);
  return;
}

Assistant:

void mpp_show_support_format()
{
    RK_U32 i = 0;

    mpp_log("mpp coding type support list:");

    for (i = 0; i < MPP_ARRAY_ELEMS(support_list); i++) {
        MppCodingTypeInfo *info = &support_list[i];
        mpp_log("type: %s id %d coding: %-16s id %d\n",
                info->type_name, info->type,
                info->coding_name, info->coding);
    }
}